

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O3

nn_optset * nn_sock_optset(nn_sock *self,int id)

{
  nn_transport *pnVar1;
  nn_optset *pnVar2;
  
  if (-5 < id) {
    pnVar2 = self->optsets[(uint)~id];
    if (pnVar2 == (nn_optset *)0x0) {
      pnVar1 = nn_global_transport(id);
      if ((pnVar1 == (nn_transport *)0x0) || (pnVar1->optset == (_func_nn_optset_ptr *)0x0)) {
        pnVar2 = (nn_optset *)0x0;
      }
      else {
        pnVar2 = (*pnVar1->optset)();
        self->optsets[(uint)~id] = pnVar2;
      }
    }
    return pnVar2;
  }
  return (nn_optset *)0x0;
}

Assistant:

static struct nn_optset *nn_sock_optset (struct nn_sock *self, int id)
{
    int index;
    const struct nn_transport *tp;

    /*  Transport IDs are negative and start from -1. */
    index = (-id) - 1;

    /*  Check for invalid indices. */
    if (nn_slow (index < 0 || index >= NN_MAX_TRANSPORT))
        return NULL;

    /*  If the option set already exists return it. */
    if (nn_fast (self->optsets [index] != NULL))
        return self->optsets [index];

    /*  If the option set doesn't exist yet, create it. */
    tp = nn_global_transport (id);
    if (nn_slow (!tp))
        return NULL;
    if (nn_slow (!tp->optset))
        return NULL;
    self->optsets [index] = tp->optset ();

    return self->optsets [index];
}